

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstream.cpp
# Opt level: O0

void init_streamclass(HSQUIRRELVM v)

{
  long lVar1;
  SQRegFunction *f;
  SQInteger i;
  HSQUIRRELVM v_local;
  
  sq_pushregistrytable(v);
  sq_pushstring(v,"std_stream",0xffffffffffffffff);
  lVar1 = sq_get(v,0xfffffffffffffffe);
  if (lVar1 < 0) {
    sq_pushstring(v,"std_stream",0xffffffffffffffff);
    sq_newclass(v,0);
    sq_settypetag(v,0xffffffffffffffff,0x80000000);
    for (f = (SQRegFunction *)0x0; _stream_methods[(long)f].name != (SQChar *)0x0;
        f = (SQRegFunction *)((long)&f->name + 1)) {
      sq_pushstring(v,_stream_methods[(long)f].name,0xffffffffffffffff);
      sq_newclosure(v,_stream_methods[(long)f].f,0);
      sq_setparamscheck(v,_stream_methods[(long)f].nparamscheck,_stream_methods[(long)f].typemask);
      sq_newslot(v,0xfffffffffffffffd,0);
    }
    sq_newslot(v,0xfffffffffffffffd,0);
    sq_pushroottable(v);
    sq_pushstring(v,"stream",0xffffffffffffffff);
    sq_pushstring(v,"std_stream",0xffffffffffffffff);
    sq_get(v,0xfffffffffffffffc);
    sq_newslot(v,0xfffffffffffffffd,0);
    sq_pop(v,1);
  }
  else {
    sq_pop(v,1);
  }
  sq_pop(v,1);
  return;
}

Assistant:

void init_streamclass(HSQUIRRELVM v)
{
    sq_pushregistrytable(v);
    sq_pushstring(v,_SC("std_stream"),-1);
    if(SQ_FAILED(sq_get(v,-2))) {
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_newclass(v,SQFalse);
        sq_settypetag(v,-1,(SQUserPointer)((SQUnsignedInteger)SQSTD_STREAM_TYPE_TAG));
        SQInteger i = 0;
        while(_stream_methods[i].name != 0) {
            const SQRegFunction &f = _stream_methods[i];
            sq_pushstring(v,f.name,-1);
            sq_newclosure(v,f.f,0);
            sq_setparamscheck(v,f.nparamscheck,f.typemask);
            sq_newslot(v,-3,SQFalse);
            i++;
        }
        sq_newslot(v,-3,SQFalse);
        sq_pushroottable(v);
        sq_pushstring(v,_SC("stream"),-1);
        sq_pushstring(v,_SC("std_stream"),-1);
        sq_get(v,-4);
        sq_newslot(v,-3,SQFalse);
        sq_pop(v,1);
    }
    else {
        sq_pop(v,1); //result
    }
    sq_pop(v,1);
}